

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O0

void * mi_reallocn(void *p,size_t count,size_t size)

{
  void *pvVar1;
  size_t in_RSI;
  size_t in_RDI;
  
  mi_prim_get_default_heap();
  pvVar1 = mi_heap_reallocn((mi_heap_t *)count,(void *)size,in_RDI,in_RSI);
  return pvVar1;
}

Assistant:

mi_decl_nodiscard void* mi_reallocn(void* p, size_t count, size_t size) mi_attr_noexcept {
  return mi_heap_reallocn(mi_prim_get_default_heap(),p,count,size);
}